

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_value.cpp
# Opt level: O0

bool __thiscall Am_Value::operator==(Am_Value *this,Am_Value *test_value)

{
  Am_ID_Tag AVar1;
  uint uVar2;
  bool local_35;
  Am_Value *test_value_local;
  Am_Value *this_local;
  
  AVar1 = Am_Type_Class(this->type);
  if (AVar1 == 0) {
    uVar2 = (uint)this->type;
    if (uVar2 == 0) {
      this_local._7_1_ = test_value->type == 0;
    }
    else if (uVar2 == 1) {
      this_local._7_1_ = test_value->type == 1;
    }
    else if (uVar2 - 2 < 2) {
      this_local._7_1_ = operator==(test_value,(this->value).long_value);
    }
    else if (uVar2 == 4) {
      this_local._7_1_ = operator==(test_value,(bool)((this->value).char_value & 1));
    }
    else if (uVar2 == 5) {
      this_local._7_1_ = operator==(test_value,(this->value).float_value);
    }
    else if (uVar2 == 7) {
      this_local._7_1_ = operator==(test_value,(this->value).char_value);
    }
    else if (uVar2 == 9) {
      this_local._7_1_ = operator==(test_value,(this->value).voidptr_value);
    }
    else if (uVar2 == 10) {
      this_local._7_1_ = operator==(test_value,(this->value).proc_value);
    }
    else if ((uVar2 == 0x8006) || (uVar2 == 0x8008)) {
      this_local._7_1_ = operator==(test_value,(this->value).wrapper_value);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else if (AVar1 == 0x1000) {
    this_local._7_1_ = test_value->type == this->type;
  }
  else if (AVar1 == 0x2000) {
    this_local._7_1_ = operator==(test_value,(this->value).wrapper_value);
  }
  else if (AVar1 == 0x3000) {
    this_local._7_1_ = operator==(test_value,(this->value).method_value);
  }
  else if (AVar1 == 0x4000) {
    local_35 = false;
    if (this->type == test_value->type) {
      local_35 = (test_value->value).wrapper_value == (this->value).wrapper_value;
    }
    this_local._7_1_ = local_35;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
Am_Value::operator==(const Am_Value &test_value) const
{
  switch (Am_Type_Class(type)) {
  case Am_SIMPLE_TYPE:
    switch (type) {
    case Am_STRING:
    case Am_DOUBLE:
      return test_value == value.wrapper_value;
    case Am_VOIDPTR:
      return test_value == value.voidptr_value;
    case Am_INT:
    case Am_LONG:
      return test_value == value.long_value;
    case Am_BOOL:
      return test_value == value.bool_value;
    case Am_FLOAT:
      return test_value == value.float_value;
    case Am_CHAR:
      return test_value == value.char_value;
    case Am_PROC:
      return test_value == value.proc_value;
    case Am_NONE:
      return test_value.type == Am_NONE;
    case Am_ZERO:
      return test_value.type == Am_ZERO;
    default:
      return false;
    }
  case Am_WRAPPER:
    return test_value == value.wrapper_value;
  case Am_METHOD:
    return test_value == value.method_value;
  case Am_ENUM:
    return type == test_value.type &&
           test_value.value.long_value == value.long_value;
  case Am_ERROR_VALUE_TYPE:
    return test_value.type == type;
  }
  return false; // should never get here, but need to return something
}